

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QIcon *icon)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  const_reference pQVar4;
  undefined8 *in_RSI;
  QPixmap *in_RDI;
  long in_FS_OFFSET;
  int i;
  int num_entries;
  QPixmapIconEngine *engine;
  qsizetype in_stack_ffffffffffffff48;
  QDataStream *in_stack_ffffffffffffff50;
  QPixmap *pQVar5;
  QPixmap *in_stack_ffffffffffffff58;
  QPixmap *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  QIcon *in_stack_ffffffffffffff78;
  int local_70;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QDataStream::version((QDataStream *)in_RDI);
  if (iVar2 < 9) {
    iVar2 = QDataStream::version((QDataStream *)in_RDI);
    if (iVar2 == 8) {
      bVar1 = QIcon::isNull((QIcon *)in_stack_ffffffffffffff50);
      if (bVar1) {
        QDataStream::operator<<((QDataStream *)in_RDI,0);
      }
      else {
        qVar3 = QList<QPixmapIconEngineEntry>::size
                          ((QList<QPixmapIconEngineEntry> *)(*(long *)*in_RSI + 8));
        QDataStream::operator<<((QDataStream *)in_RDI,(int)qVar3);
        for (local_70 = 0; local_70 < (int)qVar3; local_70 = local_70 + 1) {
          pQVar5 = in_RDI;
          QList<QPixmapIconEngineEntry>::at
                    ((QList<QPixmapIconEngineEntry> *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          operator<<((QDataStream *)in_stack_ffffffffffffff60,pQVar5);
          in_stack_ffffffffffffff60 = in_RDI;
          pQVar4 = QList<QPixmapIconEngineEntry>::at
                             ((QList<QPixmapIconEngineEntry> *)in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
          operator<<((QDataStream *)in_stack_ffffffffffffff60,(QString *)&pQVar4->fileName);
          pQVar5 = in_RDI;
          pQVar4 = QList<QPixmapIconEngineEntry>::at
                             ((QList<QPixmapIconEngineEntry> *)in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
          operator<<((QDataStream *)pQVar5,(QSize *)&pQVar4->size);
          QList<QPixmapIconEngineEntry>::at
                    ((QList<QPixmapIconEngineEntry> *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          QDataStream::operator<<
                    (in_stack_ffffffffffffff50,(quint32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          QList<QPixmapIconEngineEntry>::at
                    ((QList<QPixmapIconEngineEntry> *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48);
          QDataStream::operator<<
                    (in_stack_ffffffffffffff50,(quint32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        }
      }
    }
    else {
      pQVar5 = in_RDI;
      QIcon::pixmap(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                    (int)in_stack_ffffffffffffff70,(Mode)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                    (State)in_stack_ffffffffffffff68);
      operator<<((QDataStream *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QPixmap::~QPixmap(pQVar5);
    }
  }
  else {
    bVar1 = QIcon::isNull((QIcon *)in_stack_ffffffffffffff50);
    if (bVar1) {
      QString::QString((QString *)0x28f0b0);
      operator<<((QDataStream *)in_RDI,(QString *)local_20);
      QString::~QString((QString *)0x28f0cf);
    }
    else {
      (**(code **)(**(long **)*in_RSI + 0x38))(local_38);
      operator<<((QDataStream *)in_RDI,(QString *)local_38);
      QString::~QString((QString *)0x28f113);
      (**(code **)(**(long **)*in_RSI + 0x50))(*(long **)*in_RSI,in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDataStream *)in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QIcon &icon)
{
    if (s.version() >= QDataStream::Qt_4_3) {
        if (icon.isNull()) {
            s << QString();
        } else {
            s << icon.d->engine->key();
            icon.d->engine->write(s);
        }
    } else if (s.version() == QDataStream::Qt_4_2) {
        if (icon.isNull()) {
            s << 0;
        } else {
            QPixmapIconEngine *engine = static_cast<QPixmapIconEngine *>(icon.d->engine);
            int num_entries = engine->pixmaps.size();
            s << num_entries;
            for (int i=0; i < num_entries; ++i) {
                s << engine->pixmaps.at(i).pixmap;
                s << engine->pixmaps.at(i).fileName;
                s << engine->pixmaps.at(i).size;
                s << (uint) engine->pixmaps.at(i).mode;
                s << (uint) engine->pixmaps.at(i).state;
            }
        }
    } else {
        s << QPixmap(icon.pixmap(22,22));
    }
    return s;
}